

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void cmCTestTestHandler::AddConfigurations
               (cmCTest *ctest,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *attempted,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *attemptedConfigs,string *filepath,string *filename)

{
  string *psVar1;
  string tempPath;
  allocator local_79;
  value_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  cmCTest *local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_38 = ctest;
  if ((filepath->_M_string_length != 0) &&
     ((filepath->_M_dataplus)._M_p[filepath->_M_string_length - 1] != '/')) {
    std::__cxx11::string::append((char *)filepath);
  }
  std::operator+(&local_58,filepath,filename);
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(attempted,&local_78);
  std::__cxx11::string::string((string *)&local_58,"",&local_79);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)attemptedConfigs,
             &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  psVar1 = cmCTest::GetConfigType_abi_cxx11_(local_38);
  if (psVar1->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::__cxx11::string::append((char *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,&local_78);
    std::__cxx11::string::string((string *)&local_58,"Release",&local_79);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)attemptedConfigs
               ,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::__cxx11::string::append((char *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,&local_78);
    std::__cxx11::string::string((string *)&local_58,"Debug",&local_79);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)attemptedConfigs
               ,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::__cxx11::string::append((char *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,&local_78);
    std::__cxx11::string::string((string *)&local_58,"MinSizeRel",&local_79);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)attemptedConfigs
               ,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::__cxx11::string::append((char *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,&local_78);
    std::__cxx11::string::string((string *)&local_58,"RelWithDebInfo",&local_79);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)attemptedConfigs
               ,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::__cxx11::string::append((char *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,&local_78);
    std::__cxx11::string::string((string *)&local_58,"Deployment",&local_79);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)attemptedConfigs
               ,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::__cxx11::string::append((char *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,&local_78);
    std::__cxx11::string::string((string *)&local_58,"Deployment",&local_79);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)attemptedConfigs
               ,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_78);
    cmCTest::GetConfigType_abi_cxx11_(local_38);
    std::__cxx11::string::append((string *)&local_78);
    std::__cxx11::string::append((char *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,&local_78);
    psVar1 = cmCTest::GetConfigType_abi_cxx11_(local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,psVar1);
    cmCTest::GetConfigType_abi_cxx11_(local_38);
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::__cxx11::string::append((char *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::__cxx11::string::append((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,&local_78);
    psVar1 = cmCTest::GetConfigType_abi_cxx11_(local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,psVar1);
  }
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void cmCTestTestHandler
::AddConfigurations(cmCTest *ctest,
                    std::vector<std::string> &attempted,
                    std::vector<std::string> &attemptedConfigs,
                    std::string filepath,
                    std::string &filename)
{
  std::string tempPath;

  if (!filepath.empty() &&
      filepath[filepath.size()-1] != '/')
    {
    filepath += "/";
    }
  tempPath = filepath + filename;
  attempted.push_back(tempPath);
  attemptedConfigs.push_back("");

  if(!ctest->GetConfigType().empty())
    {
    tempPath = filepath;
    tempPath += ctest->GetConfigType();
    tempPath += "/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back(ctest->GetConfigType());
    // If the file is an OSX bundle then the configtype
    // will be at the start of the path
    tempPath = ctest->GetConfigType();
    tempPath += "/";
    tempPath += filepath;
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back(ctest->GetConfigType());
    }
  else
    {
    // no config specified - try some options...
    tempPath = filepath;
    tempPath += "Release/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("Release");
    tempPath = filepath;
    tempPath += "Debug/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("Debug");
    tempPath = filepath;
    tempPath += "MinSizeRel/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("MinSizeRel");
    tempPath = filepath;
    tempPath += "RelWithDebInfo/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("RelWithDebInfo");
    tempPath = filepath;
    tempPath += "Deployment/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("Deployment");
    tempPath = filepath;
    tempPath += "Development/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("Deployment");
    }
}